

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

ElementSegment * __thiscall
wasm::Module::addElementSegment
          (Module *this,
          unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr)

{
  ElementSegment *pEVar1;
  string local_40;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_20;
  allocator<char> local_11;
  
  local_20._M_head_impl =
       (curr->_M_t).
       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
       super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
  (curr->_M_t).
  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"addElementSegment",&local_11);
  pEVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>,std::unordered_map<wasm::Name,wasm::ElementSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::ElementSegment*>>>,wasm::ElementSegment>
                     (&this->elementSegments,&this->elementSegmentsMap,
                      (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
            ((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
             &local_20);
  return pEVar1;
}

Assistant:

ElementSegment*
Module::addElementSegment(std::unique_ptr<ElementSegment>&& curr) {
  return addModuleElement(
    elementSegments, elementSegmentsMap, std::move(curr), "addElementSegment");
}